

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<Fad<Fad<double>_>,_3>::Resize(TPZManVector<Fad<Fad<double>_>,_3> *this,int64_t newsize)

{
  double dVar1;
  undefined1 auVar2 [16];
  Fad<Fad<double>_> *pFVar3;
  ostream *this_00;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  Fad<Fad<double>_> *pFVar7;
  long in_RSI;
  TPZManVector<Fad<Fad<double>_>,_3> *in_RDI;
  ulong uVar8;
  int64_t i_1;
  Fad<Fad<double>_> *newstore;
  int64_t realsize;
  int64_t i;
  Fad<Fad<double>_> *in_stack_ffffffffffffff18;
  Fad<Fad<double>_> *in_stack_ffffffffffffff20;
  Fad<Fad<double>_> *local_c8;
  Fad<Fad<double>_> *in_stack_ffffffffffffff40;
  Fad<Fad<double>_> *pFVar9;
  Fad<Fad<double>_> *local_98;
  long local_40;
  long local_18;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements) {
    if ((in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc < in_RSI) {
      if (in_RSI < 4) {
        if ((in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fStore != in_RDI->fExtAlloc) {
          for (local_18 = 0; local_18 < (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements;
              local_18 = local_18 + 1) {
            Fad<Fad<double>_>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          }
          pFVar7 = (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fStore;
          if (pFVar7 != (Fad<Fad<double>_> *)0x0) {
            dVar1 = pFVar7[-1].defaultVal.defaultVal;
            for (pFVar9 = pFVar7 + (long)dVar1; pFVar7 != pFVar9; pFVar9 = pFVar9 + -1) {
              Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffff20);
            }
            operator_delete__(&pFVar7[-1].defaultVal.defaultVal,(long)dVar1 * 0x58 + 8);
          }
          (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fStore = in_RDI->fExtAlloc;
        }
        (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc = 0;
      }
      else {
        uVar4 = ExpandSize(in_RDI,in_RSI);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar4;
        uVar5 = SUB168(auVar2 * ZEXT816(0x58),0);
        uVar8 = uVar5 + 8;
        if (SUB168(auVar2 * ZEXT816(0x58),8) != 0 || 0xfffffffffffffff7 < uVar5) {
          uVar8 = 0xffffffffffffffff;
        }
        puVar6 = (ulong *)operator_new__(uVar8);
        *puVar6 = uVar4;
        pFVar7 = (Fad<Fad<double>_> *)(puVar6 + 1);
        if (uVar4 != 0) {
          local_98 = pFVar7;
          do {
            Fad<Fad<double>_>::Fad(in_stack_ffffffffffffff40);
            local_98 = local_98 + 1;
          } while (local_98 != pFVar7 + uVar4);
        }
        for (local_40 = 0; local_40 < (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements;
            local_40 = local_40 + 1) {
          Fad<Fad<double>_>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        }
        if (((in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fStore != in_RDI->fExtAlloc) &&
           (pFVar9 = (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fStore,
           pFVar9 != (Fad<Fad<double>_> *)0x0)) {
          pFVar3 = pFVar9 + -1;
          dVar1 = pFVar9[-1].defaultVal.defaultVal;
          local_c8 = pFVar9 + (long)dVar1;
          if (pFVar9 != local_c8) {
            do {
              local_c8 = local_c8 + -1;
              Fad<Fad<double>_>::~Fad(local_c8);
            } while (local_c8 != pFVar9);
          }
          operator_delete__(&(pFVar3->defaultVal).defaultVal,(long)dVar1 * 0x58 + 8);
        }
        (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fStore = pFVar7;
        (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc = uVar4;
      }
    }
    else {
      (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}